

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap_secure.hpp
# Opt level: O3

void __thiscall
ot::commissioner::coap::CoapSecure::Connect
          (CoapSecure *this,ConnectHandler *aOnConnected,string *aPeerAddr,uint16_t aPeerPort)

{
  uint uVar1;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  string_view fmt;
  format_args args;
  _Any_data local_c0;
  code *local_b0;
  undefined1 local_a0 [8];
  _Alloc_hider local_98;
  char local_88 [16];
  string local_78;
  pointer local_58;
  size_type sStack_50;
  ulong local_48;
  ulong local_38;
  
  uVar1 = UdpSocket::Connect((this->mSocket).
                             super___shared_ptr<ot::commissioner::UdpSocket,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr,aPeerAddr,aPeerPort);
  if ((uVar1 == 0) || ((aOnConnected->super__Function_base)._M_manager == (_Manager_type)0x0)) {
    std::function<void_(ot::commissioner::DtlsSession_&,_ot::commissioner::Error)>::function
              ((function<void_(ot::commissioner::DtlsSession_&,_ot::commissioner::Error)> *)
               &local_c0,aOnConnected);
    DtlsSession::Connect(&this->mDtlsSession,(ConnectHandler *)&local_c0);
    if (local_b0 != (code *)0x0) {
      (*local_b0)(&local_c0,&local_c0,__destroy_functor);
    }
  }
  else {
    ::fmt::v10::detail::
    check_format_string<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short_&,_int_&,_FMT_COMPILE_STRING,_0>
              ();
    local_58 = (aPeerAddr->_M_dataplus)._M_p;
    sStack_50 = aPeerAddr->_M_string_length;
    local_48 = (ulong)aPeerPort;
    local_38 = (ulong)uVar1;
    fmt.size_ = 0x12d;
    fmt.data_ = (char *)0x32;
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)&local_58;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_78,(v10 *)"connect socket to peer addr={}, port={} failed: {}",fmt,args);
    local_a0._0_4_ = kIOError;
    local_98._M_p = local_88;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_98,local_78._M_dataplus._M_p,
               local_78._M_dataplus._M_p + local_78._M_string_length);
    if ((aOnConnected->super__Function_base)._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    (*aOnConnected->_M_invoker)((_Any_data *)aOnConnected,&this->mDtlsSession,(Error *)local_a0);
    if (local_98._M_p != local_88) {
      operator_delete(local_98._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p);
    }
  }
  return;
}

Assistant:

void Connect(DtlsSession::ConnectHandler aOnConnected, const std::string &aPeerAddr, uint16_t aPeerPort)
    {
        if (int fail = mSocket->Connect(aPeerAddr, aPeerPort))
        {
            if (aOnConnected != nullptr)
            {
                aOnConnected(mDtlsSession, ERROR_IO_ERROR("connect socket to peer addr={}, port={} failed: {}",
                                                          aPeerAddr, aPeerPort, fail));
                ExitNow();
            }
        }
        mDtlsSession.Connect(aOnConnected);

    exit:
        return;
    }